

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O2

void nn_fsm_start(nn_fsm *self)

{
  int iVar1;
  
  iVar1 = nn_fsm_isidle(self);
  if (iVar1 != 0) {
    (*self->fn)(self,-2,-2,(void *)0x0);
    self->state = 2;
    return;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_fsm_isidle (self)",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/aio/fsm.c",
          0x70);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_fsm_start (struct nn_fsm *self)
{
    nn_assert (nn_fsm_isidle (self));
    self->fn (self, NN_FSM_ACTION, NN_FSM_START, NULL);
    self->state = NN_FSM_STATE_ACTIVE;
}